

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O0

void ST::format_type(format_spec *format,format_writer *output,wchar_t *wtext)

{
  char *text;
  size_t size;
  string local_60;
  undefined1 local_40 [8];
  char_buffer utf8;
  wchar_t *wtext_local;
  format_writer *output_local;
  format_spec *format_local;
  
  if (wtext != (wchar_t *)0x0) {
    utf8.m_data._8_8_ = wtext;
    string::from_wchar(&local_60,wtext,0xffffffffffffffff,check_validity);
    string::to_utf8((char_buffer *)local_40,&local_60);
    string::~string(&local_60);
    text = buffer<char>::data((char_buffer *)local_40);
    size = buffer<char>::size((char_buffer *)local_40);
    format_string(format,output,text,size,align_left);
    buffer<char>::~buffer((buffer<char> *)local_40);
  }
  return;
}

Assistant:

inline void format_type(const ST::format_spec &format, ST::format_writer &output,
                            const wchar_t *wtext)
    {
        if (wtext) {
            ST::char_buffer utf8 = ST::string::from_wchar(wtext).to_utf8();
            ST::format_string(format, output, utf8.data(), utf8.size());
        }
    }